

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

UDate __thiscall
icu_63::CalendarAstronomer::riseOrSet
          (CalendarAstronomer *this,CoordFunc *func,UBool rise,double diameter,double refraction,
          double epsilon)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double local_58;
  double dStack_50;
  double local_40;
  double local_38;
  double local_30;
  
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_40 = refraction;
  local_38 = diameter;
  local_30 = epsilon;
  dVar1 = tan(this->fLatitude);
  iVar6 = 5;
  do {
    (**func->_vptr_CoordFunc)(func,&local_58,this);
    dVar7 = tan(dStack_50);
    dVar7 = acos(dVar7 * -dVar1);
    if (rise != '\0') {
      dVar7 = 6.283185307179586 - dVar7;
    }
    dVar2 = lstToUT(this,((dVar7 + local_58) * 24.0) / 6.283185307179586);
    dVar7 = this->fTime;
    this->fTime = dVar2;
    dVar3 = uprv_getNaN_63();
    this->julianDay = dVar3;
    this->julianCentury = dVar3;
    this->sunLongitude = dVar3;
    this->meanAnomalySun = dVar3;
    this->moonLongitude = dVar3;
    this->moonEclipLong = dVar3;
    this->meanAnomalyMoon = dVar3;
    this->eclipObliquity = dVar3;
    this->siderealTime = dVar3;
    this->siderealT0 = dVar3;
    this->moonPositionSet = '\0';
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) break;
    dVar7 = uprv_fabs_63(dVar2 - dVar7);
  } while (local_30 < dVar7);
  dVar1 = cos(dStack_50);
  dVar7 = sin(this->fLatitude);
  dVar7 = acos(dVar7 / dVar1);
  dVar2 = sin(local_38 * 0.5 + local_40);
  dVar7 = sin(dVar7);
  dVar7 = asin(dVar2 / dVar7);
  lVar4 = (long)(((dVar7 * 240.0 * 57.29577951308232) / dVar1) * 1000.0);
  lVar5 = -lVar4;
  if (rise == '\0') {
    lVar5 = lVar4;
  }
  return (double)lVar5 + this->fTime;
}

Assistant:

UDate CalendarAstronomer::riseOrSet(CoordFunc& func, UBool rise,
                                    double diameter, double refraction,
                                    double epsilon)
{
    Equatorial pos;
    double      tanL   = ::tan(fLatitude);
    double     deltaT = 0;
    int32_t         count = 0;

    //
    // Calculate the object's position at the current time, then use that
    // position to calculate the time of rising or setting.  The position
    // will be different at that time, so iterate until the error is allowable.
    //
    U_DEBUG_ASTRO_MSG(("setup rise=%s, dia=%.3lf, ref=%.3lf, eps=%.3lf\n",
        rise?"T":"F", diameter, refraction, epsilon));
    do {
        // See "Practical Astronomy With Your Calculator, section 33.
        func.eval(pos, *this);
        double angle = ::acos(-tanL * ::tan(pos.declination));
        double lst = ((rise ? CalendarAstronomer_PI2-angle : angle) + pos.ascension ) * 24 / CalendarAstronomer_PI2;

        // Convert from LST to Universal Time.
        UDate newTime = lstToUT( lst );

        deltaT = newTime - fTime;
        setTime(newTime);
        U_DEBUG_ASTRO_MSG(("%d] dT=%.3lf, angle=%.3lf, lst=%.3lf,   A=%.3lf/D=%.3lf\n",
            count, deltaT, angle, lst, pos.ascension, pos.declination));
    }
    while (++ count < 5 && uprv_fabs(deltaT) > epsilon);

    // Calculate the correction due to refraction and the object's angular diameter
    double cosD  = ::cos(pos.declination);
    double psi   = ::acos(sin(fLatitude) / cosD);
    double x     = diameter / 2 + refraction;
    double y     = ::asin(sin(x) / ::sin(psi));
    long  delta  = (long)((240 * y * RAD_DEG / cosD)*SECOND_MS);

    return fTime + (rise ? -delta : delta);
}